

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

int __thiscall TreeModel::rowCount(TreeModel *this,UModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  TreeItem *local_28;
  TreeItem *parentItem;
  UModelIndex *parent_local;
  TreeModel *this_local;
  
  iVar2 = UModelIndex::column(parent);
  if (iVar2 < 1) {
    bVar1 = UModelIndex::isValid(parent);
    if (bVar1) {
      local_28 = (TreeItem *)UModelIndex::internalPointer(parent);
    }
    else {
      local_28 = this->rootItem;
    }
    this_local._4_4_ = TreeItem::childCount(local_28);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int TreeModel::rowCount(const UModelIndex &parent) const
{
    TreeItem *parentItem;
    if (parent.column() > 0)
        return 0;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
        parentItem = static_cast<TreeItem*>(parent.internalPointer());
    
    return parentItem->childCount();
}